

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsMemoryStressCase.cpp
# Opt level: O2

int __thiscall deqp::gls::MemoryStressCase::init(MemoryStressCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *this_00;
  bool bVar1;
  undefined7 extraout_var;
  NotSupportedError *this_01;
  allocator<char> local_199;
  MessageBuilder local_198;
  
  bVar1 = tcu::CommandLine::isOutOfMemoryTestEnabled
                    (((this->super_TestCase).super_TestNode.m_testCtx)->m_cmdLine);
  if (bVar1) {
    return (int)CONCAT71(extraout_var,bVar1);
  }
  local_198.m_log = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  this_00 = &local_198.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,
                  "Tests that exhaust memory are disabled, use --deqp-test-oom=enable command line option to enable."
                 );
  tcu::MessageBuilder::operator<<(&local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"OOM tests disabled",&local_199);
  tcu::NotSupportedError::NotSupportedError(this_01,(string *)&local_198);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void MemoryStressCase::init (void)
{
	if (!m_testCtx.getCommandLine().isOutOfMemoryTestEnabled())
	{
		m_testCtx.getLog() << TestLog::Message << "Tests that exhaust memory are disabled, use --deqp-test-oom=enable command line option to enable." << TestLog::EndMessage;
		throw tcu::NotSupportedError("OOM tests disabled");
	}
}